

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

int run_test_fs_readdir_empty_dir(void)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  undefined8 uStack_390;
  uv_fs_t rmdir_req;
  uv_fs_t mkdir_req;
  
  uVar3 = uv_default_loop();
  uv_fs_mkdir(uVar3,&mkdir_req,"./empty_dir/",0x1ff,0);
  uv_fs_req_cleanup(&mkdir_req);
  memset(&opendir_req,0xdb,0x1b8);
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_opendir(uVar3,&opendir_req,"./empty_dir/",0);
  pvVar1 = opendir_req.ptr;
  if (iVar2 == 0) {
    if (opendir_req.fs_type == UV_FS_OPENDIR) {
      if (opendir_req.result == 0) {
        if (opendir_req.ptr == (void *)0x0) {
          pcVar4 = "opendir_req.ptr != NULL";
          uStack_390 = 0x79;
        }
        else {
          uv_fs_req_cleanup(&opendir_req);
          memset(&readdir_req,0xdb,0x1b8);
          *(uv_dirent_t **)pvVar1 = dirents;
          *(undefined8 *)((long)pvVar1 + 8) = 1;
          uVar3 = uv_default_loop();
          iVar2 = uv_fs_readdir(uVar3,&readdir_req,pvVar1,0);
          if (iVar2 == 0) {
            uv_fs_req_cleanup(&readdir_req);
            memset(&closedir_req,0xdb,0x1b8);
            uVar3 = uv_default_loop();
            uv_fs_closedir(uVar3,&closedir_req,pvVar1,0);
            if (closedir_req.result == 0) {
              uv_fs_req_cleanup(&closedir_req);
              memset(&opendir_req,0xdb,0x1b8);
              memset(&readdir_req,0xdb,0x1b8);
              memset(&closedir_req,0xdb,0x1b8);
              uVar3 = uv_default_loop();
              iVar2 = uv_fs_opendir(uVar3,&opendir_req,"./empty_dir/",empty_opendir_cb);
              if (iVar2 == 0) {
                if (empty_opendir_cb_count == 0) {
                  if (empty_closedir_cb_count == 0) {
                    uVar3 = uv_default_loop();
                    iVar2 = uv_run(uVar3,0);
                    if (iVar2 == 0) {
                      if (empty_opendir_cb_count == 1) {
                        if (empty_closedir_cb_count == 1) {
                          uVar3 = uv_default_loop();
                          uv_fs_rmdir(uVar3,&rmdir_req,"./empty_dir/",0);
                          uv_fs_req_cleanup(&rmdir_req);
                          loop = (uv_loop_t *)uv_default_loop();
                          close_loop(loop);
                          uVar3 = uv_default_loop();
                          iVar2 = uv_loop_close(uVar3);
                          if (iVar2 == 0) {
                            return 0;
                          }
                          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                          uStack_390 = 0x9f;
                        }
                        else {
                          pcVar4 = "empty_closedir_cb_count == 1";
                          uStack_390 = 0x9c;
                        }
                      }
                      else {
                        pcVar4 = "empty_opendir_cb_count == 1";
                        uStack_390 = 0x9b;
                      }
                    }
                    else {
                      pcVar4 = "r == 0";
                      uStack_390 = 0x9a;
                    }
                  }
                  else {
                    pcVar4 = "empty_closedir_cb_count == 0";
                    uStack_390 = 0x98;
                  }
                }
                else {
                  pcVar4 = "empty_opendir_cb_count == 0";
                  uStack_390 = 0x97;
                }
              }
              else {
                pcVar4 = "r == 0";
                uStack_390 = 0x96;
              }
            }
            else {
              pcVar4 = "closedir_req.result == 0";
              uStack_390 = 0x8b;
            }
          }
          else {
            pcVar4 = "nb_entries_read == 0";
            uStack_390 = 0x85;
          }
        }
      }
      else {
        pcVar4 = "opendir_req.result == 0";
        uStack_390 = 0x78;
      }
    }
    else {
      pcVar4 = "opendir_req.fs_type == UV_FS_OPENDIR";
      uStack_390 = 0x77;
    }
  }
  else {
    pcVar4 = "r == 0";
    uStack_390 = 0x76;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uStack_390,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_readdir_empty_dir) {
  const char* path;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  int r;
  int nb_entries_read;
  uv_dir_t* dir;

  path = "./empty_dir/";
  uv_fs_mkdir(uv_default_loop(), &mkdir_req, path, 0777, NULL);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    NULL);
  ASSERT(r == 0);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == 0);
  ASSERT(opendir_req.ptr != NULL);
  dir = opendir_req.ptr;
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  nb_entries_read = uv_fs_readdir(uv_default_loop(),
                                  &readdir_req,
                                  dir,
                                  NULL);
  ASSERT(nb_entries_read == 0);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT(closedir_req.result == 0);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  memset(&closedir_req, 0xdb, sizeof(closedir_req));

  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, empty_opendir_cb);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 0);
  ASSERT(empty_closedir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 1);
  ASSERT(empty_closedir_cb_count == 1);
  uv_fs_rmdir(uv_default_loop(), &rmdir_req, path, NULL);
  uv_fs_req_cleanup(&rmdir_req);
  MAKE_VALGRIND_HAPPY();
  return 0;
}